

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellANCF_3833::ComputeInternalForcesContIntPreInt
          (ChElementShellANCF_3833 *this,ChVectorDynamic<> *Fi)

{
  Matrix<double,__1,__1,_0,__1,__1> *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ChVectorDynamic<> *pCVar8;
  double *pdVar9;
  void *pvVar10;
  ulong uVar11;
  undefined8 *puVar12;
  Index outer;
  long lVar13;
  double *pdVar14;
  char *__function;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_3,_0,_24,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>_>
  *pCVar15;
  long lVar16;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_3,_0,_24,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>_>
  *a_lhs;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  Map<Eigen::Matrix<double,_576,_1,_0,_576,_1>,_0,_Eigen::Stride<0,_0>_> K1_vec;
  MatrixNx3 QiCompactLiu;
  Matrix3xN ebar;
  Matrix3xN ebardot;
  MatrixNxN K1_matrix;
  MatrixNxN PI1_matrix;
  add_assign_op<double,_double> local_2b81;
  ChVectorDynamic<> *local_2b80;
  plainobjectbase_evaluator_data<double,_24> local_2b78;
  plainobjectbase_evaluator_data<double,_24> local_2b70;
  Transpose<Eigen::Matrix<double,_3,_24,_1,_3,_24>_> local_2b68;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
  local_2b60;
  undefined1 local_2b40 [16];
  scalar_constant_op<double> local_2b30;
  RhsNested local_2b28;
  Matrix3xN *local_2b18;
  double adStack_2b00 [64];
  Matrix3xN local_2900;
  Matrix3xN local_26c0;
  Matrix<double,_24,_24,_0,_24,_24> local_2480;
  Matrix<double,_24,_24,_1,_24,_24> local_1280;
  
  local_2b80 = Fi;
  CalcCoordMatrix(this,&local_2900);
  CalcCoordDerivMatrix(this,&local_26c0);
  a_lhs = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_3,_0,_24,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>_>
           *)&local_2480;
  local_2480.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage.m_data.array
  [2] = 0.5;
  local_2480.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage.m_data.array
  [3] = (double)&local_2900;
  local_2480.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage.m_data.array
  [5] = (double)&local_2900;
  memset(&local_1280,0,0x1200);
  local_2b40._0_8_ = 1.0;
  Eigen::internal::
  generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,24,3,0,24,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,24,1,3,24>>const>,Eigen::Matrix<double,3,24,1,3,24>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,24,24,1,24,24>>
            (&local_1280,a_lhs,&local_2900,(Scalar *)local_2b40);
  if (this->m_damping_enabled == true) {
    local_2b30.m_other = this->m_Alpha;
    local_2b18 = &local_2900;
    local_2b28.m_matrix = &local_26c0;
    memset(&local_2480,0,0x1200);
    local_2b60.m_dst = (DstEvaluatorType *)0x3ff0000000000000;
    Eigen::internal::
    generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,24,3,0,24,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,24,1,3,24>>const>,Eigen::Matrix<double,3,24,1,3,24>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::scaleAndAddTo<Eigen::Matrix<double,24,24,0,24,24>>
              (&local_2480,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_3,_0,_24,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>_>
                *)local_2b40,&local_2900,(Scalar *)&local_2b60);
    local_2b60.m_src = (SrcEvaluatorType *)&local_2b70;
    local_2b70.data = (double *)&local_2480;
    local_2b60.m_dst = (DstEvaluatorType *)&local_2b78;
    local_2b60.m_functor = &local_2b81;
    local_2b78.data = (double *)&local_1280;
    local_2b60.m_dstExpr = &local_1280;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>,_Eigen::internal::add_assign_op<double,_double>,_0>,_0,_1>
    ::run(&local_2b60);
  }
  local_2b40._0_8_ = &this->m_O1;
  local_2b60.m_dst = (DstEvaluatorType *)a_lhs;
  local_2b40._8_8_ = &local_1280;
  if ((this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
      == 0x240) {
    if ((this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_rows != 0x240) {
      __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                    "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double, 576, 1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<double, 576, 1>>]"
                   );
    }
    Eigen::internal::
    generic_product_impl_base<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Map<Eigen::Matrix<double,576,1,0,576,1>,0,Eigen::Stride<0,0>>,Eigen::internal::generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Map<Eigen::Matrix<double,576,1,0,576,1>,0,Eigen::Stride<0,0>>,Eigen::DenseShape,Eigen::DenseShape,7>>
    ::evalTo<Eigen::Map<Eigen::Matrix<double,576,1,0,576,1>,0,Eigen::Stride<0,0>>>
              ((Map<Eigen::Matrix<double,_576,_1,_0,_576,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_2b60
               ,(Matrix<double,__1,__1,_0,__1,__1> *)local_2b40._0_8_,
               (Map<Eigen::Matrix<double,_576,_1,_0,_576,_1>,_0,_Eigen::Stride<0,_0>_> *)
               (local_2b40 + 8));
    if (((this->m_K3Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         m_storage.m_rows != 0x18) ||
       ((this->m_K3Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
        m_storage.m_cols != 0x18)) {
      __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, 24, 24, 1>, const Eigen::Matrix<double, -1, -1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, 24, 24, 1>, Rhs = const Eigen::Matrix<double, -1, -1>]"
                   );
    }
    pdVar14 = (this->m_K3Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_data;
    this_00 = &this->m_K13Compact;
    if (((this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         m_storage.m_rows != 0x18) ||
       ((this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
        m_storage.m_cols != 0x18)) {
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)this_00,0x240,0x18,0x18);
      if (((this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows != 0x18) ||
         ((this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols != 0x18)) {
        __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, 24, 24, 1>, const Eigen::Matrix<double, -1, -1>>, T1 = double, T2 = double]"
                     );
      }
    }
    pdVar9 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
    lVar13 = 0;
    do {
      lVar16 = 0;
      pCVar15 = a_lhs;
      do {
        dVar1 = *(double *)pCVar15;
        pCVar15 = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_3,_0,_24,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>_>
                   *)&pCVar15[4].field_0x20;
        pdVar9[lVar16] = dVar1 - pdVar14[lVar16];
        lVar16 = lVar16 + 1;
      } while (lVar16 != 0x18);
      lVar13 = lVar13 + 1;
      pdVar14 = pdVar14 + 0x18;
      a_lhs = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_3,_0,_24,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>_>
               *)&a_lhs->m_lhs;
      pdVar9 = pdVar9 + 0x18;
    } while (lVar13 != 0x18);
    if ((this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
        m_storage.m_cols == 0x18) {
      local_2b70.data = (double *)this_00;
      local_2b68.m_matrix = &local_2900;
      memset((Matrix<double,_24,_3,_1,_24,_3> *)local_2b40,0,0x240);
      local_2b78.data = (double *)0x3ff0000000000000;
      Eigen::internal::
      generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Transpose<Eigen::Matrix<double,3,24,1,3,24>>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::scaleAndAddTo<Eigen::Matrix<double,24,3,1,24,3>>
                ((Matrix<double,_24,_3,_1,_24,_3> *)local_2b40,this_00,&local_2b68,
                 (Scalar *)&local_2b78);
      pCVar8 = local_2b80;
      pdVar14 = (local_2b80->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                m_storage.m_data;
      if ((local_2b80->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows != 0x48) {
        if (pdVar14 != (double *)0x0) {
          free((void *)pdVar14[-1]);
        }
        pvVar10 = malloc(0x280);
        if (pvVar10 == (void *)0x0) {
          puVar12 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar12 = std::ostream::_M_insert<bool>;
          __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        *(void **)(((ulong)pvVar10 & 0xffffffffffffffc0) + 0x38) = pvVar10;
        pdVar14 = (double *)(((ulong)pvVar10 & 0xffffffffffffffc0) + 0x40);
        (pCVar8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
             pdVar14;
        (pCVar8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows =
             0x48;
      }
      uVar11 = 0xfffffffffffffff8;
      do {
        dVar1 = adStack_2b00[uVar11 + 1];
        dVar2 = adStack_2b00[uVar11 + 2];
        dVar3 = adStack_2b00[uVar11 + 3];
        dVar4 = adStack_2b00[uVar11 + 4];
        dVar5 = adStack_2b00[uVar11 + 5];
        dVar6 = adStack_2b00[uVar11 + 6];
        dVar7 = adStack_2b00[uVar11 + 7];
        pdVar9 = pdVar14 + uVar11 + 8;
        *pdVar9 = adStack_2b00[uVar11];
        pdVar9[1] = dVar1;
        pdVar9[2] = dVar2;
        pdVar9[3] = dVar3;
        pdVar9[4] = dVar4;
        pdVar9[5] = dVar5;
        pdVar9[6] = dVar6;
        pdVar9[7] = dVar7;
        uVar11 = uVar11 + 8;
      } while (uVar11 < 0x40);
      return;
    }
    __function = 
    "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Transpose<Eigen::Matrix<double, 3, 24, 1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Transpose<Eigen::Matrix<double, 3, 24, 1>>, Option = 0]"
    ;
  }
  else {
    __function = 
    "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Map<Eigen::Matrix<double, 576, 1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Map<Eigen::Matrix<double, 576, 1>>, Option = 0]"
    ;
  }
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,__function);
}

Assistant:

void ChElementShellANCF_3833::ComputeInternalForcesContIntPreInt(ChVectorDynamic<>& Fi) {
    // Calculate the generalize internal force vector using the "Pre-Integration" style of method assuming a
    // linear viscoelastic material model (single term damping model).  For this style of method, the components of the
    // generalized internal force vector and its Jacobian that need to be integrated across the volume are calculated
    // once prior to the start of the simulation.  This makes this method well suited for applications with many
    // discrete layers since the in-simulation calculations are independent of the number of Gauss quadrature points
    // used throughout the entire element.

    Matrix3xN ebar;
    Matrix3xN ebardot;

    CalcCoordMatrix(ebar);
    CalcCoordDerivMatrix(ebardot);

    // Calculate PI1 which is a combined form of the nodal coordinates.  It is calculated in matrix form and then later
    // reshaped into vector format (through a simple reinterpretation of the data)
    MatrixNxN PI1_matrix = 0.5 * ebar.transpose() * ebar;

    // If damping is enabled adjust PI1 to account for the extra terms.  This is the only modification required to
    // include damping in the generalized internal force calculation
    if (m_damping_enabled) {
        PI1_matrix += m_Alpha * ebardot.transpose() * ebar;
    }

    MatrixNxN K1_matrix;

    // Setup the reshaped/reinterpreted/mapped forms of PI1 and K1 to make the calculation of K1 simpler
    Eigen::Map<ChVectorN<double, NSF * NSF>> PI1(PI1_matrix.data(), PI1_matrix.size());
    Eigen::Map<ChVectorN<double, NSF * NSF>> K1_vec(K1_matrix.data(), K1_matrix.size());

    // Calculate the matrix K1 in mapped vector form and the resulting matrix will be in the correct form to combine
    // with K3
    K1_vec.noalias() = m_O1 * PI1;

    // Store the combined sum of K1 and K3 since it will be used again in the Jacobian calculation
    m_K13Compact.noalias() = K1_matrix - m_K3Compact;

    // Multiply the combined K1 and K3 matrix by the nodal coordinates in compact form and then remap it into the
    // required vector order that is the generalized internal force vector
    MatrixNx3 QiCompactLiu = m_K13Compact * ebar.transpose();
    Eigen::Map<Vector3N> QiReshapedLiu(QiCompactLiu.data(), QiCompactLiu.size());

    Fi = QiReshapedLiu;
}